

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lttng.cpp
# Opt level: O0

void writeLttng(QFile *file,Provider *provider)

{
  long lVar1;
  Provider *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QString fileName;
  QTextStream stream;
  Data *this;
  QIODevice *in_stack_ffffffffffffff88;
  Provider *provider_00;
  QTextStream *in_stack_ffffffffffffff90;
  QTextStream *stream_00;
  QTextStream local_48 [3];
  Provider *in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Data *stream_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (Data *)0xaaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  uVar2 = 0xaaaaaaaa;
  uVar3 = 0xaaaaaaaa;
  uVar4 = 0xaaaaaaaa;
  uVar5 = 0xaaaaaaaa;
  stream_00 = local_48;
  stream_01 = this;
  (**(code **)((long)&((in_RDI->d_ptr)._M_t.
                       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>
                       .super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl)->
                      savedToUtf16 + 8))();
  provider_00 = (Provider *)&stack0xffffffffffffffd0;
  QFileInfo::QFileInfo((QFileInfo *)stream_00,(QString *)provider_00);
  QFileInfo::fileName((QFileInfo *)&stack0xffffffffffffffd8);
  QFileInfo::~QFileInfo((QFileInfo *)0x117101);
  QString::~QString((QString *)0x11710b);
  writePrologue((QTextStream *)CONCAT44(uVar5,uVar4),(QString *)CONCAT44(uVar3,uVar2),
                in_stack_ffffffffffffffd0);
  writeEnums(in_RDI,in_RSI);
  writeFlags((QTextStream *)stream_01,(Provider *)CONCAT44(uVar5,uVar4));
  writeTracepoints(stream_00,provider_00);
  writeEpilogue(stream_00,&provider_00->name);
  QString::~QString((QString *)0x117165);
  QTextStream::~QTextStream((QTextStream *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void writeLttng(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeEnums(stream, provider);
    writeFlags(stream, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}